

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::mirror(CImg<unsigned_char> *this,char axis)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  CImgArgumentException *this_00;
  char *pcVar9;
  char *pcVar10;
  uint local_70;
  uint v;
  uint _spectrum2;
  uint z;
  int c;
  uint depth2;
  uint y;
  uint zv;
  uint height2;
  uint uStack_48;
  uchar val;
  uint x;
  uint yzv;
  uint width2;
  uchar *buf;
  uchar *pb;
  uchar *pf;
  char axis_local;
  CImg<unsigned_char> *this_local;
  
  bVar6 = is_empty(this);
  if (!bVar6) {
    _yzv = (void *)0x0;
    cVar7 = cimg::lowercase(axis);
    switch(cVar7) {
    case 'c':
      _yzv = operator_new__((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
      pb = this->_data;
      buf = data(this,0,0,0,this->_spectrum - 1);
      uVar8 = this->_spectrum;
      for (local_70 = 0; local_70 < uVar8 >> 1; local_70 = local_70 + 1) {
        memcpy(_yzv,pb,(ulong)(this->_width * this->_height * this->_depth));
        memcpy(pb,buf,(ulong)(this->_width * this->_height * this->_depth));
        memcpy(buf,_yzv,(ulong)(this->_width * this->_height * this->_depth));
        pb = pb + (ulong)this->_width * (ulong)this->_height * (ulong)this->_depth;
        buf = buf + -((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
      }
      break;
    default:
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
      uVar8 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      puVar5 = this->_data;
      pcVar9 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar9 = "";
      }
      pcVar10 = pixel_type();
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::mirror(): Invalid specified axis \'%c\'."
                 ,(ulong)uVar8,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar9,pcVar10,
                 (int)axis);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                  CImgArgumentException::~CImgArgumentException);
    case 'x':
      pb = this->_data;
      buf = data(this,this->_width - 1,0,0,0);
      uVar8 = this->_width >> 1;
      for (uStack_48 = 0; uStack_48 < this->_height * this->_depth * this->_spectrum;
          uStack_48 = uStack_48 + 1) {
        for (height2 = 0; height2 < uVar8; height2 = height2 + 1) {
          uVar1 = *pb;
          *pb = *buf;
          *buf = uVar1;
          buf = buf + -1;
          pb = pb + 1;
        }
        pb = pb + (this->_width - uVar8);
        buf = buf + (this->_width + uVar8);
      }
      break;
    case 'y':
      _yzv = operator_new__((ulong)this->_width);
      pb = this->_data;
      buf = data(this,0,this->_height - 1,0,0);
      uVar8 = this->_height >> 1;
      for (depth2 = 0; depth2 < this->_depth * this->_spectrum; depth2 = depth2 + 1) {
        for (c = 0; (uint)c < uVar8; c = c + 1) {
          memcpy(_yzv,pb,(ulong)this->_width);
          memcpy(pb,buf,(ulong)this->_width);
          memcpy(buf,_yzv,(ulong)this->_width);
          pb = pb + this->_width;
          buf = buf + -(ulong)this->_width;
        }
        pb = pb + (ulong)this->_width * (ulong)(this->_height - uVar8);
        buf = buf + (ulong)this->_width * (ulong)(this->_height + uVar8);
      }
      break;
    case 'z':
      _yzv = operator_new__((ulong)this->_width * (ulong)this->_height);
      pb = this->_data;
      buf = data(this,0,0,this->_depth - 1,0);
      uVar8 = this->_depth >> 1;
      for (_spectrum2 = 0; (int)_spectrum2 < (int)this->_spectrum; _spectrum2 = _spectrum2 + 1) {
        for (v = 0; v < uVar8; v = v + 1) {
          memcpy(_yzv,pb,(ulong)(this->_width * this->_height));
          memcpy(pb,buf,(ulong)(this->_width * this->_height));
          memcpy(buf,_yzv,(ulong)(this->_width * this->_height));
          pb = pb + (ulong)this->_width * (ulong)this->_height;
          buf = buf + -((ulong)this->_width * (ulong)this->_height);
        }
        pb = pb + (ulong)this->_width * (ulong)this->_height * (ulong)(this->_depth - uVar8);
        buf = buf + (ulong)this->_width * (ulong)this->_height * (ulong)(this->_depth + uVar8);
      }
    }
    if (_yzv != (void *)0x0) {
      operator_delete__(_yzv);
    }
  }
  return this;
}

Assistant:

CImg<T>& mirror(const char axis) {
      if (is_empty()) return *this;
      T *pf, *pb, *buf = 0;
      switch (cimg::lowercase(axis)) {
      case 'x' : {
        pf = _data; pb = data(_width - 1);
        const unsigned int width2 = _width/2;
        for (unsigned int yzv = 0; yzv<_height*_depth*_spectrum; ++yzv) {
          for (unsigned int x = 0; x<width2; ++x) { const T val = *pf; *(pf++) = *pb; *(pb--) = val; }
          pf+=_width - width2;
          pb+=_width + width2;
        }
      } break;
      case 'y' : {
        buf = new T[_width];
        pf = _data; pb = data(0,_height - 1);
        const unsigned int height2 = _height/2;
        for (unsigned int zv = 0; zv<_depth*_spectrum; ++zv) {
          for (unsigned int y = 0; y<height2; ++y) {
            std::memcpy(buf,pf,_width*sizeof(T));
            std::memcpy(pf,pb,_width*sizeof(T));
            std::memcpy(pb,buf,_width*sizeof(T));
            pf+=_width;
            pb-=_width;
          }
          pf+=(ulongT)_width*(_height - height2);
          pb+=(ulongT)_width*(_height + height2);
        }
      } break;
      case 'z' : {
        buf = new T[(ulongT)_width*_height];
        pf = _data; pb = data(0,0,_depth - 1);
        const unsigned int depth2 = _depth/2;
        cimg_forC(*this,c) {
          for (unsigned int z = 0; z<depth2; ++z) {
            std::memcpy(buf,pf,_width*_height*sizeof(T));
            std::memcpy(pf,pb,_width*_height*sizeof(T));
            std::memcpy(pb,buf,_width*_height*sizeof(T));
            pf+=(ulongT)_width*_height;
            pb-=(ulongT)_width*_height;
          }
          pf+=(ulongT)_width*_height*(_depth - depth2);
          pb+=(ulongT)_width*_height*(_depth + depth2);
        }
      } break;
      case 'c' : {
        buf = new T[(ulongT)_width*_height*_depth];
        pf = _data; pb = data(0,0,0,_spectrum - 1);
        const unsigned int _spectrum2 = _spectrum/2;
        for (unsigned int v = 0; v<_spectrum2; ++v) {
          std::memcpy(buf,pf,_width*_height*_depth*sizeof(T));
          std::memcpy(pf,pb,_width*_height*_depth*sizeof(T));
          std::memcpy(pb,buf,_width*_height*_depth*sizeof(T));
          pf+=(ulongT)_width*_height*_depth;
          pb-=(ulongT)_width*_height*_depth;
        }
      } break;
      default :
        throw CImgArgumentException(_cimg_instance
                                    "mirror(): Invalid specified axis '%c'.",
                                    cimg_instance,
                                    axis);
      }
      delete[] buf;
      return *this;
    }